

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeTrace.cpp
# Opt level: O1

string * __thiscall
slang::escapeString_abi_cxx11_(string *__return_storage_ptr__,slang *this,string_view src)

{
  slang __c;
  slang *psVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this != (slang *)0x0) {
    psVar1 = (slang *)0x0;
    do {
      __c = psVar1[src._M_len];
      if ((((ulong)(byte)__c < 0x30) && ((0x800400003700U >> ((ulong)(byte)__c & 0x3f) & 1) != 0))
         || (__c == (slang)0x5c)) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,'\\');
LAB_00153202:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,(char)__c);
      }
      else if ((byte)((char)__c - 0x20U) < 0x5f) goto LAB_00153202;
      psVar1 = psVar1 + 1;
    } while (this != psVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string escapeString(std::string_view src) {
    std::string result;
    for (char c : src) {
        switch (c) {
            case '"':
            case '/':
            case '\\':
            case '\b':
            case '\f':
            case '\n':
            case '\r':
            case '\t':
                result += '\\';
                result += c;
                break;
            default:
                if (isPrintableASCII(c))
                    result += c;
                break;
        }
    }
    return result;
}